

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O1

gdImagePtr gdImageCreateFromWBMP(FILE *inFile)

{
  gdIOCtx *infile;
  gdImagePtr pgVar1;
  
  infile = gdNewFileCtx(inFile);
  if (infile == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromWBMPCtx(infile);
    (*infile->gd_free)(infile);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMP(FILE *inFile)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewFileCtx(inFile);
	if (in == NULL) return NULL;
	im = gdImageCreateFromWBMPCtx(in);
	in->gd_free(in);
	return im;
}